

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

SVInt __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::getValue(UnbasedUnsizedIntegerLiteral *this)

{
  char cVar1;
  Type *pTVar2;
  logic_error *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long in_RSI;
  SVInt SVar4;
  string local_f8;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_1e;
  undefined1 local_1d;
  bitwidth_t local_1c;
  bool isSigned;
  bitwidth_t width;
  UnbasedUnsizedIntegerLiteral *this_local;
  SVInt *tmp;
  undefined8 uVar3;
  
  this_local = this;
  pTVar2 = not_null<const_slang::ast::Type_*>::operator->
                     ((not_null<const_slang::ast::Type_*> *)(in_RSI + 8));
  local_1c = Type::getBitWidth(pTVar2);
  pTVar2 = not_null<const_slang::ast::Type_*>::operator->
                     ((not_null<const_slang::ast::Type_*> *)(in_RSI + 8));
  local_1d = Type::isSigned(pTVar2);
  cVar1 = *(char *)(in_RSI + 0x30);
  if (cVar1 == '\0') {
    SVInt::SVInt((SVInt *)this,local_1c,0,(bool)local_1d);
    uVar3 = extraout_RDX;
  }
  else if (cVar1 == '\x01') {
    local_1e = 0;
    SVInt::SVInt((SVInt *)this,local_1c,0,(bool)local_1d);
    SVInt::setAllOnes((SVInt *)this);
    uVar3 = extraout_RDX_00;
  }
  else if (cVar1 == '@') {
    SVar4 = SVInt::createFillZ((SVInt *)this,local_1c,(bool)local_1d);
    uVar3 = SVar4.super_SVIntStorage._8_8_;
  }
  else {
    if (cVar1 != -0x80) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
                 ,&local_d1);
      std::operator+(&local_b0,&local_d0,":");
      std::__cxx11::to_string(&local_f8,0xa8);
      std::operator+(&local_90,&local_b0,&local_f8);
      std::operator+(&local_70,&local_90,": ");
      std::operator+(&local_50,&local_70,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_50);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    SVar4 = SVInt::createFillX((SVInt *)this,local_1c,(bool)local_1d);
    uVar3 = SVar4.super_SVIntStorage._8_8_;
  }
  SVar4.super_SVIntStorage.bitWidth = (int)uVar3;
  SVar4.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar3 >> 0x20);
  SVar4.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar3 >> 0x28);
  SVar4.super_SVIntStorage._14_2_ = (short)((ulong)uVar3 >> 0x30);
  SVar4.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar4.super_SVIntStorage;
}

Assistant:

SVInt UnbasedUnsizedIntegerLiteral::getValue() const {
    bitwidth_t width = type->getBitWidth();
    bool isSigned = type->isSigned();

    switch (value.value) {
        case 0:
            return SVInt(width, 0, isSigned);
        case 1: {
            SVInt tmp(width, 0, isSigned);
            tmp.setAllOnes();
            return tmp;
        }
        case logic_t::X_VALUE:
            return SVInt::createFillX(width, isSigned);
        case logic_t::Z_VALUE:
            return SVInt::createFillZ(width, isSigned);
        default:
            ASSUME_UNREACHABLE;
    }
}